

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resample_by_2_internal.c
# Opt level: O2

void WebRtcSpl_UpBy2IntToShort(int32_t *in,int32_t len,int16_t *out,int32_t *state)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  
  uVar1 = 0;
  uVar3 = (ulong)(uint)len;
  if (len < 1) {
    uVar3 = uVar1;
  }
  for (; (uint)((int)uVar3 * 2) != uVar1; uVar1 = uVar1 + 2) {
    iVar5 = *(int *)((long)in + uVar1 * 2);
    iVar6 = state[5];
    iVar2 = ((iVar5 - iVar6) + 0x2000 >> 0xe) * 0x335 + state[4];
    state[4] = iVar5;
    state[5] = iVar2;
    iVar2 = iVar2 - state[6];
    iVar6 = ((iVar2 >> 0xe) - (iVar2 >> 0x1f)) * 0x17de + iVar6;
    iVar5 = iVar6 - state[7];
    iVar5 = ((iVar5 >> 0xe) - (iVar5 >> 0x1f)) * 0x305e + state[6];
    state[7] = iVar5;
    state[6] = iVar6;
    iVar5 = iVar5 >> 0xf;
    if (0x7ffe < iVar5) {
      iVar5 = 0x7fff;
    }
    if (iVar5 < -0x7fff) {
      iVar5 = -0x8000;
    }
    out[(int)uVar1] = (int16_t)iVar5;
  }
  for (lVar4 = 0; uVar3 * 2 != lVar4; lVar4 = lVar4 + 2) {
    iVar5 = *(int *)((long)in + lVar4 * 2);
    iVar6 = state[1];
    iVar2 = ((iVar5 - iVar6) + 0x2000 >> 0xe) * 0xbea + *state;
    *state = iVar5;
    state[1] = iVar2;
    iVar2 = iVar2 - state[2];
    iVar6 = ((iVar2 >> 0xe) - (iVar2 >> 0x1f)) * 0x2498 + iVar6;
    iVar5 = iVar6 - state[3];
    iVar5 = ((iVar5 >> 0xe) - (iVar5 >> 0x1f)) * 0x3ad7 + state[2];
    state[3] = iVar5;
    state[2] = iVar6;
    iVar5 = iVar5 >> 0xf;
    if (0x7ffe < iVar5) {
      iVar5 = 0x7fff;
    }
    if (iVar5 < -0x7fff) {
      iVar5 = -0x8000;
    }
    out[(long)(int)lVar4 + 1] = (int16_t)iVar5;
  }
  return;
}

Assistant:

void WebRtcSpl_UpBy2IntToShort(const int32_t *in, int32_t len, int16_t *out,
                               int32_t *state)
{
    int32_t tmp0, tmp1, diff;
    int32_t i;

    // upper allpass filter (generates odd output samples)
    for (i = 0; i < len; i++)
    {
        tmp0 = in[i];
        diff = tmp0 - state[5];
        // scale down and round
        diff = (diff + (1 << 13)) >> 14;
        tmp1 = state[4] + diff * kResampleAllpass[0][0];
        state[4] = tmp0;
        diff = tmp1 - state[6];
        // scale down and round
        diff = diff >> 14;
        if (diff < 0)
            diff += 1;
        tmp0 = state[5] + diff * kResampleAllpass[0][1];
        state[5] = tmp1;
        diff = tmp0 - state[7];
        // scale down and truncate
        diff = diff >> 14;
        if (diff < 0)
            diff += 1;
        state[7] = state[6] + diff * kResampleAllpass[0][2];
        state[6] = tmp0;

        // scale down, saturate and store
        tmp1 = state[7] >> 15;
        if (tmp1 > (int32_t)0x00007FFF)
            tmp1 = 0x00007FFF;
        if (tmp1 < (int32_t)0xFFFF8000)
            tmp1 = 0xFFFF8000;
        out[i << 1] = (int16_t)tmp1;
    }

    out++;

    // lower allpass filter (generates even output samples)
    for (i = 0; i < len; i++)
    {
        tmp0 = in[i];
        diff = tmp0 - state[1];
        // scale down and round
        diff = (diff + (1 << 13)) >> 14;
        tmp1 = state[0] + diff * kResampleAllpass[1][0];
        state[0] = tmp0;
        diff = tmp1 - state[2];
        // scale down and truncate
        diff = diff >> 14;
        if (diff < 0)
            diff += 1;
        tmp0 = state[1] + diff * kResampleAllpass[1][1];
        state[1] = tmp1;
        diff = tmp0 - state[3];
        // scale down and truncate
        diff = diff >> 14;
        if (diff < 0)
            diff += 1;
        state[3] = state[2] + diff * kResampleAllpass[1][2];
        state[2] = tmp0;

        // scale down, saturate and store
        tmp1 = state[3] >> 15;
        if (tmp1 > (int32_t)0x00007FFF)
            tmp1 = 0x00007FFF;
        if (tmp1 < (int32_t)0xFFFF8000)
            tmp1 = 0xFFFF8000;
        out[i << 1] = (int16_t)tmp1;
    }
}